

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

char * get_header(mg_header *hdr,int num_hdr,char *name)

{
  long lVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)num_hdr;
  if (num_hdr < 1) {
    uVar4 = 0;
  }
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (uVar4 * 0x10 + 0x10 == lVar3 + 0x10) {
      return (char *)0x0;
    }
    iVar2 = mg_strcasecmp(name,*(char **)((long)&hdr->name + lVar3));
    lVar1 = lVar3 + 0x10;
  } while (iVar2 != 0);
  return *(char **)((long)&hdr->value + lVar3);
}

Assistant:

static const char *
get_header(const struct mg_header *hdr, int num_hdr, const char *name)
{
	int i;
	for (i = 0; i < num_hdr; i++) {
		if (!mg_strcasecmp(name, hdr[i].name)) {
			return hdr[i].value;
		}
	}

	return NULL;
}